

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

Error asmjit::formatFuncArgs
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,FuncDetail *fd,
                VirtReg **vRegs)

{
  Error EVar1;
  StringBuilder *in_RCX;
  size_t in_RDX;
  undefined4 in_ESI;
  StringBuilder *in_RDI;
  long in_R8;
  Error _err_2;
  Error _err_1;
  Error _err;
  uint32_t i;
  char *in_stack_00000350;
  int in_stack_0000035c;
  char *in_stack_00000360;
  undefined4 in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  StringBuilder *in_stack_ffffffffffffff78;
  Value in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  Error in_stack_ffffffffffffff8c;
  uint local_6c;
  
  local_6c = 0;
  while( true ) {
    if ((byte)in_RCX[2]._length <= local_6c) {
      return 0;
    }
    if ((local_6c != 0) &&
       (EVar1 = StringBuilder::_opString
                          ((StringBuilder *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           in_stack_ffffffffffffff84._value,(char *)in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff70), EVar1 != 0)) {
      return EVar1;
    }
    if (0x1f < (ulong)local_6c) {
      DebugUtils::assertionFailed(in_stack_00000360,in_stack_0000035c,in_stack_00000350);
    }
    in_stack_ffffffffffffff88 = *(undefined4 *)((long)&in_RCX[3]._length + (ulong)local_6c * 4);
    in_stack_ffffffffffffff70 = in_RDX;
    in_stack_ffffffffffffff78 = in_RCX;
    in_stack_ffffffffffffff8c =
         formatFuncDetailValue
                   (in_RCX,(uint32_t)(in_RDX >> 0x20),
                    (CodeEmitter *)CONCAT44(in_ESI,in_stack_ffffffffffffff68),
                    in_stack_ffffffffffffff84);
    if (in_stack_ffffffffffffff8c != 0) break;
    if (in_R8 != 0) {
      EVar1 = StringBuilder::appendFormat
                        (in_RDI," {%s}",*(undefined8 *)(*(long *)(in_R8 + (ulong)local_6c * 8) + 8))
      ;
      if (EVar1 != 0) {
        return EVar1;
      }
      in_stack_ffffffffffffff84._value = 0;
    }
    local_6c = local_6c + 1;
  }
  return in_stack_ffffffffffffff8c;
}

Assistant:

static Error formatFuncArgs(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  const FuncDetail& fd,
  VirtReg* const* vRegs) noexcept {

  for (uint32_t i = 0; i < fd.getArgCount(); i++) {
    if (i) ASMJIT_PROPAGATE(sb.appendString(", "));
    ASMJIT_PROPAGATE(formatFuncDetailValue(sb, logOptions, emitter, fd.getArg(i)));

#if !defined(ASMJIT_DISABLE_COMPILER)
    if (vRegs)
      ASMJIT_PROPAGATE(sb.appendFormat(" {%s}", vRegs[i]->getName()));
#endif // !ASMJIT_DISABLE_COMPILER
  }

  return kErrorOk;
}